

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

Role __thiscall QAccessibleToolButton::role(QAccessibleToolButton *this)

{
  bool bVar1;
  ToolButtonPopupMode TVar2;
  Role RVar3;
  QObject *object;
  QToolButton *this_00;
  QMenu *pQVar4;
  
  object = (QObject *)QAccessibleButton::button(&this->super_QAccessibleButton);
  this_00 = QtPrivate::qobject_cast_helper<QToolButton*,QObject>(object);
  pQVar4 = QToolButton::menu(this_00);
  if (pQVar4 == (QMenu *)0x0) {
    bVar1 = QAbstractButton::isCheckable(&this_00->super_QAbstractButton);
    RVar3 = bVar1 + Button;
  }
  else {
    TVar2 = QToolButton::popupMode(this_00);
    RVar3 = ButtonMenu - (TVar2 == DelayedPopup);
  }
  return RVar3;
}

Assistant:

QAccessible::Role QAccessibleToolButton::role() const
{
#if QT_CONFIG(menu)
    QAbstractButton *ab = button();
    QToolButton *tb = qobject_cast<QToolButton*>(ab);
    if (!tb->menu())
        return tb->isCheckable() ? QAccessible::CheckBox : QAccessible::PushButton;
    else if (tb->popupMode() == QToolButton::DelayedPopup)
        return QAccessible::ButtonDropDown;
#endif

    return QAccessible::ButtonMenu;
}